

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allintra_vis.c
# Opt level: O0

int get_window_wiener_var(AV1_COMP *cpi,BLOCK_SIZE bsize,int mi_row,int mi_col)

{
  byte bVar1;
  byte bVar2;
  short sVar3;
  short sVar4;
  int iVar5;
  long lVar6;
  double dVar7;
  double dVar8;
  uint uVar9;
  long lVar10;
  int in_ECX;
  int in_EDX;
  byte in_SIL;
  long in_RDI;
  WeberStats *weber_stats;
  int col;
  int row;
  double base_reg;
  double base_den;
  double base_num;
  int mb_count;
  int mb_stride;
  int sb_wiener_var;
  int mi_step;
  int mi_high;
  int mi_wide;
  AV1_COMMON *cm;
  int local_94;
  int local_58;
  int local_54;
  double local_50;
  double local_48;
  double local_40;
  int local_38;
  
  bVar1 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"[in_SIL];
  bVar2 = "\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"[in_SIL];
  uVar9 = (uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                [*(byte *)(in_RDI + 0x9d5f8)];
  iVar5 = *(int *)(in_RDI + 0x712d4);
  local_38 = 0;
  local_40 = 1.0;
  local_48 = 1.0;
  local_50 = 1.0;
  for (local_54 = in_EDX; local_58 = in_ECX, local_54 < (int)(in_EDX + (uint)bVar2);
      local_54 = uVar9 + local_54) {
    for (; local_58 < (int)(in_ECX + (uint)bVar1); local_58 = uVar9 + local_58) {
      if ((local_54 < *(int *)(in_RDI + 0x3c194)) && (local_58 < *(int *)(in_RDI + 0x3c198))) {
        lVar10 = *(long *)(in_RDI + 0x9d5d8) +
                 (long)((local_54 / (int)uVar9) * iVar5 + local_58 / (int)uVar9) * 0x38;
        lVar6 = *(long *)(lVar10 + 0x20);
        dVar7 = sqrt((double)*(long *)(lVar10 + 8));
        local_40 = (double)lVar6 * dVar7 * (double)(int)*(short *)(lVar10 + 0x1a) + local_40;
        sVar3 = *(short *)(lVar10 + 0x1a);
        dVar7 = sqrt((double)*(long *)(lVar10 + 8));
        sVar4 = *(short *)(lVar10 + 0x18);
        dVar8 = sqrt((double)*(long *)(lVar10 + 0x10));
        local_48 = local_48 + ABS((double)(int)sVar3 * dVar7 - (double)(int)sVar4 * dVar8);
        dVar7 = sqrt((double)*(long *)(lVar10 + 0x20));
        dVar8 = sqrt((double)(int)*(short *)(lVar10 + 0x18));
        local_50 = dVar7 * dVar8 * 0.1 + local_50;
        local_38 = local_38 + 1;
      }
    }
  }
  local_94 = (int)(((local_40 + local_50) / (local_48 + local_50)) / (double)local_38);
  if (local_94 < 1) {
    local_94 = 1;
  }
  return local_94;
}

Assistant:

static int get_window_wiener_var(const AV1_COMP *const cpi, BLOCK_SIZE bsize,
                                 int mi_row, int mi_col) {
  const AV1_COMMON *const cm = &cpi->common;
  const int mi_wide = mi_size_wide[bsize];
  const int mi_high = mi_size_high[bsize];

  const int mi_step = mi_size_wide[cpi->weber_bsize];
  int sb_wiener_var = 0;
  int mb_stride = cpi->frame_info.mi_cols;
  int mb_count = 0;
  double base_num = 1;
  double base_den = 1;
  double base_reg = 1;

  for (int row = mi_row; row < mi_row + mi_high; row += mi_step) {
    for (int col = mi_col; col < mi_col + mi_wide; col += mi_step) {
      if (row >= cm->mi_params.mi_rows || col >= cm->mi_params.mi_cols)
        continue;

      const WeberStats *weber_stats =
          &cpi->mb_weber_stats[(row / mi_step) * mb_stride + (col / mi_step)];

      base_num += ((double)weber_stats->distortion) *
                  sqrt((double)weber_stats->src_variance) *
                  weber_stats->rec_pix_max;

      base_den += fabs(
          weber_stats->rec_pix_max * sqrt((double)weber_stats->src_variance) -
          weber_stats->src_pix_max * sqrt((double)weber_stats->rec_variance));

      base_reg += sqrt((double)weber_stats->distortion) *
                  sqrt((double)weber_stats->src_pix_max) * 0.1;
      ++mb_count;
    }
  }

  sb_wiener_var =
      (int)(((base_num + base_reg) / (base_den + base_reg)) / mb_count);
  sb_wiener_var = AOMMAX(1, sb_wiener_var);

  return (int)sb_wiener_var;
}